

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void __thiscall
module_overview_csv_actions::module2(module_overview_csv_actions *this,string *module)

{
  if (this->first_module_ == true) {
    this->first_module_ = false;
  }
  else {
    std::operator<<((ostream *)&std::cout," ");
  }
  std::operator<<((ostream *)&std::cout,(string *)module);
  return;
}

Assistant:

void module2( std::string const & module )
    {
        if( first_module_ )
            first_module_ = false;
        else
            std::cout << " ";
        std::cout << module;
    }